

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,ShapeSampleContext *ctx,
          Point2f u)

{
  Float FVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  float __x;
  undefined1 auVar5 [16];
  ShapeSample *pSVar6;
  Point3<float> *p2;
  Point3<float> *p2_00;
  undefined1 auVar7 [16];
  float fVar8;
  type tVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar11 [16];
  undefined1 extraout_var_01 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar26 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  uint uVar28;
  uint uVar30;
  uint uVar31;
  undefined1 auVar29 [60];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Point3<float> PVar36;
  Point3f PVar37;
  Point3f PVar38;
  Vector3f VVar39;
  Vector3<float> VVar40;
  Frame samplingFrame;
  float local_10c;
  Tuple3<pbrt::Vector3,_float> local_f8;
  Point3f local_e8;
  float local_dc;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  float local_c0;
  Tuple3<pbrt::Vector3,_float> local_b8;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_a8;
  Tuple3<pbrt::Point3,_float> local_48;
  undefined8 local_38;
  float local_30;
  undefined1 extraout_var [60];
  undefined1 auVar25 [56];
  undefined1 auVar27 [64];
  
  auVar13._8_56_ = in_register_00001208;
  auVar13._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_a8.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_a8._8_4_ = 0;
  PVar36 = Transform::operator()(this->renderFromObject,(Point3<float> *)&local_a8.__align);
  local_e8.super_Tuple3<pbrt::Point3,_float>.z = PVar36.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = in_register_00001208;
  local_e8.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar14._0_16_);
  PVar37 = ShapeSampleContext::OffsetRayOrigin(ctx,&local_e8);
  local_30 = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar15._8_56_ = in_register_00001208;
  local_38 = vmovlps_avx(auVar15._0_16_);
  fVar8 = DistanceSquared<float>((pbrt *)&local_38,&local_e8,p2);
  fVar32 = this->radius;
  if (fVar32 * fVar32 < fVar8) {
    auVar25 = extraout_var_00;
    PVar37 = ShapeSampleContext::p(ctx);
    local_a8._8_4_ = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
    auVar16._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar25;
    local_a8.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar16._0_16_);
    tVar9 = Distance<float>((Point3<float> *)&local_a8.__align,&local_e8);
    auVar7 = ZEXT816(0) << 0x40;
    fVar32 = fVar32 / tVar9;
    fVar8 = fVar32 * fVar32;
    if (0.00068523 <= fVar8) {
      auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar8)),auVar7);
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      local_10c = 1.0 - auVar12._0_4_;
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)(auVar12._0_4_ + -1.0)),auVar13._0_16_,
                                SUB6416(ZEXT464(0x3f800000),0));
      fVar4 = 1.0 - auVar12._0_4_ * auVar12._0_4_;
    }
    else {
      fVar4 = u.super_Tuple2<pbrt::Point2,_float>.x * fVar8;
      __x = 1.0 - fVar4;
      if (__x < 0.0) {
        local_d8._0_4_ = fVar8;
        local_dc = fVar4;
        auVar22._0_4_ = sqrtf(__x);
        auVar22._4_60_ = extraout_var;
        auVar12 = auVar22._0_16_;
        auVar7 = ZEXT816(0) << 0x40;
        fVar8 = (float)local_d8._0_4_;
        fVar4 = local_dc;
      }
      else {
        auVar12 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
      }
      local_10c = fVar8 * 0.5;
    }
    auVar33 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar4 / fVar8)),auVar7);
    auVar33 = vsqrtss_avx(auVar33,auVar33);
    auVar33 = vfmadd213ss_fma(auVar33,auVar12,ZEXT416((uint)(fVar4 / fVar32)));
    auVar29 = ZEXT1260(auVar33._4_12_);
    auVar12 = vmovshdup_avx(auVar13._0_16_);
    fVar32 = auVar33._0_4_;
    auVar7 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar32 * fVar32)),auVar7);
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    auVar26 = ZEXT856(auVar7._8_8_);
    VVar39 = SphericalDirection(auVar7._0_4_,fVar32,(auVar12._0_4_ + auVar12._0_4_) * 3.1415927);
    auVar27._0_4_ = VVar39.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar27._4_60_ = auVar29;
    local_d8 = auVar27._0_16_;
    auVar25 = auVar26;
    PVar37 = ShapeSampleContext::p(ctx);
    auVar23._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar23._8_56_ = auVar25;
    auVar33._8_8_ = 0;
    auVar33._0_4_ = local_e8.super_Tuple3<pbrt::Point3,_float>.x;
    auVar33._4_4_ = local_e8.super_Tuple3<pbrt::Point3,_float>.y;
    auVar7 = vsubps_avx(auVar33,auVar23._0_16_);
    local_f8.z = local_e8.super_Tuple3<pbrt::Point3,_float>.z -
                 PVar37.super_Tuple3<pbrt::Point3,_float>.z;
    local_f8._0_8_ = vmovlps_avx(auVar7);
    VVar40 = Normalize<float>((Vector3<float> *)&local_f8);
    Frame::FromZ((Frame *)&local_a8.__align,(Vector3f)VVar40.super_Tuple3<pbrt::Vector3,_float>);
    auVar7._0_8_ = VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar7._8_4_ = auVar26._0_4_ ^ 0x80000000;
    auVar7._12_4_ = auVar26._4_4_ ^ 0x80000000;
    VVar39.super_Tuple3<pbrt::Vector3,_float>.z = -(float)local_d8._0_4_;
    uVar28 = local_d8._4_4_ ^ 0x80000000;
    uVar30 = local_d8._8_4_ ^ 0x80000000;
    uVar31 = local_d8._12_4_ ^ 0x80000000;
    VVar39.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar7._0_8_;
    VVar39.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar7._0_8_ >> 0x20);
    auVar25 = ZEXT856(auVar7._8_8_);
    VVar39 = Frame::FromLocal((Frame *)&local_a8.__align,VVar39);
    fVar8 = VVar39.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_8_ = VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar24._8_56_ = auVar25;
    auVar12 = auVar24._0_16_;
    fVar32 = this->radius;
    local_f8.z = fVar8 * fVar32 + local_e8.super_Tuple3<pbrt::Point3,_float>.z;
    auVar35._0_4_ =
         local_e8.super_Tuple3<pbrt::Point3,_float>.x +
         VVar39.super_Tuple3<pbrt::Vector3,_float>.x * fVar32;
    auVar35._4_4_ =
         local_e8.super_Tuple3<pbrt::Point3,_float>.y +
         VVar39.super_Tuple3<pbrt::Vector3,_float>.y * fVar32;
    auVar35._8_4_ = auVar25._0_4_ * fVar32 + 0.0;
    auVar35._12_4_ = auVar25._4_4_ * fVar32 + 0.0;
    local_f8._0_8_ = vmovlps_avx(auVar35);
    bVar3 = this->reverseOrientation;
    if (bVar3 != false) {
      auVar12._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
      auVar12._8_4_ = -auVar25._0_4_;
      auVar12._12_4_ = -auVar25._4_4_;
    }
    auVar34._8_4_ = 0x7fffffff;
    auVar34._0_8_ = 0x7fffffff7fffffff;
    auVar34._12_4_ = 0x7fffffff;
    local_d8._4_4_ = uVar28;
    local_d8._0_4_ = (uint)(bVar3 & 1) * (int)-fVar8 + (uint)!(bool)(bVar3 & 1) * (int)fVar8;
    local_d8._8_4_ = uVar30;
    local_d8._12_4_ = uVar31;
    auVar7 = vandps_avx(auVar35,auVar34);
    auVar33 = vandps_avx(ZEXT416((uint)local_f8.z),auVar34);
    auVar5._8_4_ = 0x34a00003;
    auVar5._0_8_ = 0x34a0000334a00003;
    auVar5._12_4_ = 0x34a00003;
    auVar7 = vmulps_avx512vl(auVar7,auVar5);
    local_b8.z = auVar33._0_4_ * 2.980233e-07;
    local_b8._0_8_ = vmovlps_avx(auVar7);
    Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)&local_f8,(Vector3f *)&local_b8
                      );
    FVar1 = ctx->time;
    __return_storage_ptr__->set = true;
    *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
    uVar2 = vmovlps_avx(auVar12);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar2;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_d8._0_4_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = ZEXT816(0) << 0x20
    ;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 1.0 / (local_10c * 6.2831855);
    return __return_storage_ptr__;
  }
  Sample((optional<pbrt::ShapeSample> *)&local_a8.__align,this,u);
  FVar1 = ctx->time;
  pSVar6 = pstd::optional<pbrt::ShapeSample>::value
                     ((optional<pbrt::ShapeSample> *)&local_a8.__align);
  auVar25 = (undefined1  [56])0x0;
  (pSVar6->intr).time = FVar1;
  pSVar6 = pstd::optional<pbrt::ShapeSample>::value
                     ((optional<pbrt::ShapeSample> *)&local_a8.__align);
  PVar37 = Interaction::p(&pSVar6->intr);
  auVar17._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar17._8_56_ = auVar25;
  PVar38 = ShapeSampleContext::p(ctx);
  auVar18._0_8_ = PVar38.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar18._8_56_ = auVar25;
  auVar7 = vsubps_avx(auVar17._0_16_,auVar18._0_16_);
  local_f8.z = PVar37.super_Tuple3<pbrt::Point3,_float>.z -
               PVar38.super_Tuple3<pbrt::Point3,_float>.z;
  local_f8._0_8_ = vmovlps_avx(auVar7);
  auVar10._0_4_ = auVar7._0_4_ * auVar7._0_4_;
  auVar10._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar10._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar10._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar7 = vhaddps_avx(auVar10,auVar10);
  fVar32 = local_f8.z * local_f8.z + auVar7._0_4_;
  auVar25 = (undefined1  [56])0x0;
  if ((fVar32 != 0.0) || (NAN(fVar32))) {
    VVar40 = Normalize<float>((Vector3<float> *)&local_f8);
    local_f8.z = VVar40.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._0_8_ = VVar40.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar19._8_56_ = auVar25;
    local_f8._0_8_ = vmovlps_avx(auVar19._0_16_);
    pSVar6 = pstd::optional<pbrt::ShapeSample>::value
                       ((optional<pbrt::ShapeSample> *)&local_a8.__align);
    auVar11._0_8_ = local_f8._0_8_ ^ 0x8000000080000000;
    auVar11._8_4_ = 0x80000000;
    auVar11._12_4_ = 0x80000000;
    local_b8.z = -local_f8.z;
    local_b8._0_8_ = vmovlps_avx(auVar11);
    tVar9 = AbsDot<float>(&(pSVar6->intr).n,(Vector3<float> *)&local_b8);
    auVar25 = extraout_var_01;
    PVar37 = ShapeSampleContext::p(ctx);
    local_c0 = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
    auVar20._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar20._8_56_ = auVar25;
    local_c8 = vmovlps_avx(auVar20._0_16_);
    pSVar6 = pstd::optional<pbrt::ShapeSample>::value
                       ((optional<pbrt::ShapeSample> *)&local_a8.__align);
    PVar37 = Interaction::p(&pSVar6->intr);
    local_48.z = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
    auVar21._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar21._8_56_ = auVar25;
    local_48._0_8_ = vmovlps_avx(auVar21._0_16_);
    fVar32 = DistanceSquared<float>((pbrt *)&local_c8,(Point3<float> *)&local_48,p2_00);
    pSVar6 = pstd::optional<pbrt::ShapeSample>::value
                       ((optional<pbrt::ShapeSample> *)&local_a8.__align);
    pSVar6->pdf = pSVar6->pdf / (tVar9 / fVar32);
    pSVar6 = pstd::optional<pbrt::ShapeSample>::value
                       ((optional<pbrt::ShapeSample> *)&local_a8.__align);
    if (ABS(pSVar6->pdf) != INFINITY) {
      pstd::optional<pbrt::ShapeSample>::optional
                (__return_storage_ptr__,(optional<pbrt::ShapeSample> *)&local_a8.__align);
      goto LAB_0037872e;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
LAB_0037872e:
  pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)&local_a8.__align);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Sample uniformly on sphere if $\pt{}$ is inside it
        Point3f pCenter = (*renderFromObject)(Point3f(0, 0, 0));
        Point3f pOrigin = ctx.OffsetRayOrigin(pCenter);
        if (DistanceSquared(pOrigin, pCenter) <= Sqr(radius)) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample sphere uniformly inside subtended cone
        // Compute quantities related the $\theta_\roman{max}$ for cone
        Float sinThetaMax = radius / Distance(ctx.p(), pCenter);
        Float sin2ThetaMax = Sqr(sinThetaMax);
        Float cosThetaMax = SafeSqrt(1 - sin2ThetaMax);
        Float oneMinusCosThetaMax = 1 - cosThetaMax;

        // Compute $\theta$ and $\phi$ values for sample in cone
        Float cosTheta = (cosThetaMax - 1) * u[0] + 1;
        Float sin2Theta = 1 - Sqr(cosTheta);
        if (sin2ThetaMax < 0.00068523f /* sin^2(1.5 deg) */) {
            // Compute cone sample via Taylor series expansion for small angles
            sin2Theta = sin2ThetaMax * u[0];
            cosTheta = std::sqrt(1 - sin2Theta);
            oneMinusCosThetaMax = sin2ThetaMax / 2;
        }

        // Compute angle $\alpha$ from center of sphere to sampled point on surface
        Float cosAlpha = sin2Theta / sinThetaMax +
                         cosTheta * SafeSqrt(1 - sin2Theta / Sqr(sinThetaMax));
        Float sinAlpha = SafeSqrt(1 - Sqr(cosAlpha));

        // Compute surface normal and sampled point on sphere
        Float phi = u[1] * 2 * Pi;
        Vector3f w = SphericalDirection(sinAlpha, cosAlpha, phi);
        Frame samplingFrame = Frame::FromZ(Normalize(pCenter - ctx.p()));
        Normal3f n(samplingFrame.FromLocal(-w));
        Point3f p = pCenter + radius * Point3f(n.x, n.y, n.z);
        if (reverseOrientation)
            n *= -1;

        // Return _ShapeSample_ for sampled point on sphere
        // Compute _pError_ for sampled point on sphere
        Vector3f pError = gamma(5) * Abs((Vector3f)p);

        DCHECK_NE(oneMinusCosThetaMax, 0);  // very small far away sphere
        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time),
                           1 / (2 * Pi * oneMinusCosThetaMax)};
    }